

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTContext.cpp
# Opt level: O2

bool __thiscall slang::ast::ASTContext::requireBooleanConvertible(ASTContext *this,Expression *expr)

{
  bool bVar1;
  bool bVar2;
  bitwidth_t bVar3;
  uint uVar4;
  Diagnostic *diag;
  optional<unsigned_int> oVar5;
  anon_class_8_1_898b66f3 isMaskOrRShift;
  DiagCode code;
  
  bVar1 = Expression::bad(expr);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    bVar1 = Type::isBooleanConvertible((expr->type).ptr);
    code.subsystem = Expressions;
    code.code = 0x83;
    if (bVar1) {
      bVar2 = Type::isFloating((expr->type).ptr);
      code.subsystem = Expressions;
      code.code = 0xbe;
      if (!bVar2) {
        bVar2 = Type::isIntegral((expr->type).ptr);
        if (!bVar2) {
          return true;
        }
        bVar3 = Type::getBitWidth((expr->type).ptr);
        if (bVar3 < 2) {
          return true;
        }
        oVar5 = Expression::getEffectiveWidth(expr);
        if (((ulong)oVar5.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int> & 0xfffffffe) == 0 ||
            ((ulong)oVar5.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
          return true;
        }
        code.subsystem = Expressions;
        code.code = 0xc6;
        if (((expr->kind == BinaryOp) && (uVar4 = *(int *)&expr[1].constant - 5, uVar4 < 0x16)) &&
           ((0x28000dU >> (uVar4 & 0x1f) & 1) != 0)) {
          return true;
        }
      }
    }
    diag = addDiag(this,code,expr->sourceRange);
    ast::operator<<(diag,(expr->type).ptr);
  }
  return bVar1;
}

Assistant:

bool ASTContext::requireBooleanConvertible(const Expression& expr) const {
    if (expr.bad())
        return false;

    if (!expr.type->isBooleanConvertible()) {
        addDiag(diag::NotBooleanConvertible, expr.sourceRange) << *expr.type;
        return false;
    }
    else if (expr.type->isFloating()) {
        addDiag(diag::FloatBoolConv, expr.sourceRange) << *expr.type;
    }
    else if (expr.type->isIntegral() && expr.type->getBitWidth() > 1 &&
             expr.getEffectiveWidth() > 1u) {
        // Suppress the warning for cases of right shift and bitwise-AND,
        // as it's common practice to check for non-zero results like this:
        //   if (a & b) begin end
        //   if (a >> 2) begin end
        auto isMaskOrRShift = [&] {
            if (expr.kind == ExpressionKind::BinaryOp) {
                auto op = expr.as<BinaryExpression>().op;
                return op == BinaryOperator::BinaryAnd || op == BinaryOperator::LogicalShiftRight ||
                       op == BinaryOperator::ArithmeticShiftRight ||
                       op == BinaryOperator::BinaryXor || op == BinaryOperator::BinaryXnor;
            }
            return false;
        };

        if (!isMaskOrRShift())
            addDiag(diag::IntBoolConv, expr.sourceRange) << *expr.type;
    }

    return true;
}